

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_innerproduct_dropout(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar4;
  Layer *pLVar5;
  int *piVar6;
  pointer ppLVar7;
  Layer *pLVar8;
  pointer pMVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  int i_1;
  size_type sVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  int j;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong local_38;
  
  pvVar4 = (this->super_ModelWriter).layers;
  uVar17 = (long)(pvVar4->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar4->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_38 = 1;
  uVar14 = 0;
  do {
    if (uVar14 == uVar17) {
      return 0;
    }
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"InnerProduct")
    ;
    if (!bVar10) {
      iVar2 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar14]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar18 = local_38; uVar18 < uVar17; uVar18 = uVar18 + 1) {
        bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar18]->type,"Dropout")
        ;
        if (((!bVar10) &&
            (pLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar18],
            piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar6 == 4)) && (*piVar6 == iVar2)) {
          if (uVar17 != uVar18) {
            ppLVar7 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar5 = ppLVar7[uVar14];
            pLVar8 = ppLVar7[uVar18];
            fprintf(_stderr,"fuse_innerproduct_dropout %s %s\n",(pLVar5->name)._M_dataplus._M_p,
                    (pLVar8->name)._M_dataplus._M_p);
            fVar1 = *(float *)&pLVar8[1]._vptr_Layer;
            if ((fVar1 != 1.0) || (NAN(fVar1))) {
              uVar3 = *(uint *)&pLVar5[1]._vptr_Layer;
              uVar11 = *(int *)&pLVar5[1].one_blob_only / (int)uVar3;
              sVar13 = pLVar5[1].name.field_2._M_allocated_capacity;
              uVar18 = 0;
              if (0 < (int)uVar11) {
                uVar18 = (ulong)uVar11;
              }
              uVar12 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar12 = 0;
              }
              for (uVar15 = 0; uVar15 != uVar12; uVar15 = uVar15 + 1) {
                for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
                  *(float *)(sVar13 + uVar16 * 4) = *(float *)(sVar13 + uVar16 * 4) * fVar1;
                }
                sVar13 = sVar13 + (long)(int)uVar11 * 4;
              }
              if (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) != 0) {
                pMVar9 = *(pointer *)
                          ((long)&pLVar5[1].bottom_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          + 8);
                for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
                  *(float *)((long)&pMVar9->data + uVar18 * 4) =
                       *(float *)((long)&pMVar9->data + uVar18 * 4) * fVar1;
                }
              }
            }
            iVar2 = *(pLVar8->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar2;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar2].producer = (int)uVar14;
            std::__cxx11::string::assign((char *)&pLVar8->type);
          }
          break;
        }
      }
    }
    uVar14 = uVar14 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_dropout()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Dropout
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Dropout")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Dropout to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[j];

        fprintf(stderr, "fuse_innerproduct_dropout %s %s\n", innerproduct->name.c_str(), dropout->name.c_str());

        float scale = dropout->scale;
        if (scale != 1.f)
        {
            const int num_output = innerproduct->num_output;
            const int weight_per_outch = innerproduct->weight_data_size / num_output;

            float* weight = innerproduct->weight_data;
            for (int i = 0; i < num_output; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= scale;
                }
            }

            if (innerproduct->bias_term)
            {
                float* bias = innerproduct->bias_data;
                for (int i = 0; i < num_output; i++)
                {
                    bias[i] *= scale;
                }
            }
        }

        int top_blob_index_final = dropout->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        dropout->type = "ncnnfused";
    }

    return 0;
}